

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v8::basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_>::grow
          (basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_> *this,size_t size)

{
  size_t __t;
  ulong uVar1;
  buffer<unsigned_int> *__p;
  pointer p;
  size_t sVar2;
  ulong in_RSI;
  buffer<unsigned_int> *in_RDI;
  uint *new_data;
  uint *old_data;
  size_t new_capacity;
  size_t old_capacity;
  size_t max_size;
  buffer<unsigned_int> *__result;
  buffer<unsigned_int> *__last;
  uint *__first;
  size_type local_48;
  size_type local_28;
  
  local_48 = std::allocator_traits<std::allocator<unsigned_int>_>::max_size
                       ((allocator_type *)(in_RDI + 5));
  __t = detail::buffer<unsigned_int>::capacity(in_RDI);
  uVar1 = __t + (__t >> 1);
  local_28 = in_RSI;
  if ((in_RSI <= uVar1) && (local_28 = uVar1, local_48 < uVar1)) {
    if (local_48 < in_RSI) {
      local_48 = in_RSI;
    }
    local_28 = local_48;
  }
  __p = (buffer<unsigned_int> *)detail::buffer<unsigned_int>::data(in_RDI);
  p = std::allocator_traits<std::allocator<unsigned_int>_>::allocate
                ((allocator_type *)(in_RDI + 5),local_28);
  __result = __p;
  __last = __p;
  sVar2 = detail::buffer<unsigned_int>::size(in_RDI);
  __first = (uint *)((long)&__result->_vptr_buffer + sVar2 * 4);
  detail::make_checked<unsigned_int>(p,local_28);
  std::uninitialized_copy<unsigned_int*,unsigned_int*>(__first,(uint *)__last,(uint *)__result);
  detail::buffer<unsigned_int>::set(in_RDI,p,local_28);
  if (__p != in_RDI + 1) {
    __gnu_cxx::new_allocator<unsigned_int>::deallocate
              ((new_allocator<unsigned_int> *)(in_RDI + 5),(uint *)__p,__t);
  }
  return;
}

Assistant:

FMT_CONSTEXPR20 void basic_memory_buffer<T, SIZE, Allocator>::grow(
    size_t size) {
#ifdef FMT_FUZZ
  if (size > 5000) throw std::runtime_error("fuzz mode - won't grow that much");
#endif
  const size_t max_size = std::allocator_traits<Allocator>::max_size(alloc_);
  size_t old_capacity = this->capacity();
  size_t new_capacity = old_capacity + old_capacity / 2;
  if (size > new_capacity)
    new_capacity = size;
  else if (new_capacity > max_size)
    new_capacity = size > max_size ? size : max_size;
  T* old_data = this->data();
  T* new_data =
      std::allocator_traits<Allocator>::allocate(alloc_, new_capacity);
  // The following code doesn't throw, so the raw pointer above doesn't leak.
  std::uninitialized_copy(old_data, old_data + this->size(),
                          detail::make_checked(new_data, new_capacity));
  this->set(new_data, new_capacity);
  // deallocate must not throw according to the standard, but even if it does,
  // the buffer already uses the new storage and will deallocate it in
  // destructor.
  if (old_data != store_) alloc_.deallocate(old_data, old_capacity);
}